

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O1

size_t wwLoZeroBits(word *a,size_t n)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = 0;
  sVar2 = sVar1;
  if (n != 0) {
    do {
      sVar2 = sVar1;
      if (a[sVar1] != 0) break;
      sVar1 = sVar1 + 1;
      sVar2 = n;
    } while (n != sVar1);
  }
  if (sVar2 == n) {
    sVar1 = n << 6;
  }
  else {
    sVar1 = u64CTZ(a[sVar2]);
    sVar1 = sVar1 + sVar2 * 0x40;
  }
  return sVar1;
}

Assistant:

size_t wwLoZeroBits(const word a[], size_t n)
{
	register size_t i;
	ASSERT(wwIsValid(a, n));
	// поиск младшего ненулевого машинного слова
	for (i = 0; i < n && a[i] == 0; ++i);
	// нулевое слово?
	if (i == n)
		return n * B_PER_W;
	// ...ненулевое
	return i * B_PER_W + wordCTZ(a[i]);
}